

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O0

void __thiscall
duckdb::CatalogEntryMap::AddEntry
          (CatalogEntryMap *this,
          unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *entry)

{
  bool bVar1;
  pointer pCVar2;
  undefined8 uVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unique_ptr<CatalogEntry>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  string name;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
  *in_stack_fffffffffffffee0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
  *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  InternalException *in_stack_ffffffffffffff50;
  string local_98 [39];
  allocator local_71;
  string local_70 [32];
  _Self local_50 [3];
  _Self local_38;
  string local_30 [48];
  
  pCVar2 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
           operator->(in_stack_fffffffffffffee0);
  ::std::__cxx11::string::string(local_30,(string *)&pCVar2->name);
  local_38._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),(key_type *)0x2a3f53)
  ;
  local_50[0]._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  bVar1 = ::std::operator!=(&local_38,local_50);
  if (!bVar1) {
    ::std::
    make_pair<std::__cxx11::string&,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>
              (&in_RDI->first,in_stack_fffffffffffffee0);
    _Var4 = ::std::
            map<std::__cxx11::string,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>,duckdb::CaseInsensitiveStringCompare,std::allocator<std::pair<std::__cxx11::string_const,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>>
            ::
            insert<std::pair<std::__cxx11::string,duckdb::unique_ptr<duckdb::CatalogEntry,std::default_delete<duckdb::CatalogEntry>,true>>>
                      (in_stack_fffffffffffffef0,in_RDI);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>_>
             *)_Var4.first._M_node._M_node);
    ::std::__cxx11::string::~string(local_30);
    return;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_70,"Entry with name \"%s\" already exists",&local_71);
  ::std::__cxx11::string::string(local_98,local_30);
  InternalException::InternalException<std::__cxx11::string>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  __cxa_throw(uVar3,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void CatalogEntryMap::AddEntry(unique_ptr<CatalogEntry> entry) {
	auto name = entry->name;

	if (entries.find(name) != entries.end()) {
		throw InternalException("Entry with name \"%s\" already exists", name);
	}
	entries.insert(make_pair(name, std::move(entry)));
}